

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  __pid_t _Var2;
  int iVar3;
  time_t tVar4;
  int timeout;
  int i;
  int nr;
  pid_t pid;
  pollfd ufds [4];
  char tmp [92];
  sigaction act;
  int s [2];
  int fd_count;
  int fd;
  int signal_recv_fd;
  int property_set_fd;
  int init_fd;
  int in_stack_000002b4;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  int __timeout;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  pollfd local_148;
  int local_140;
  undefined2 local_13c;
  short local_13a;
  int local_138;
  undefined2 local_134;
  short local_132;
  undefined2 local_12c;
  undefined2 local_12a;
  char local_128 [60];
  int in_stack_ffffffffffffff14;
  code *local_c8;
  int in_stack_ffffffffffffff50;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = 0xffffffff;
  local_18 = 0xffffffff;
  local_1c = -1;
  _Var2 = fork();
  if (_Var2 == 0) {
    bootchart_count = bootchart_init();
    if (bootchart_count < 1) {
      if (bootchart_count < 0) {
        log_write(3,"<3>init: bootcharting init failure\n");
        local_4 = 0;
      }
      else {
        log_write(5,"<5>init: bootcharting ignored\n");
        local_4 = 0;
      }
    }
    else {
      log_write(5,"<5>init: bootcharting started (period=%d ms)\n",
                (ulong)(uint)(bootchart_count * 200));
      while ((0 < bootchart_count && (iVar3 = bootchart_step(), -1 < iVar3))) {
        bootchart_count = bootchart_count + -1;
        usleep(200000);
      }
      bootchart_finish();
      local_4 = 0;
    }
  }
  else {
    local_c8 = sigchld_handler;
    sigemptyset((sigset_t *)&stack0xffffffffffffff40);
    sigaction(0x11,(sigaction *)&local_c8,(sigaction *)0x0);
    umask(0);
    log_init();
    log_write(6,"<6>init: reading config file\n");
    parse_config_file(in_stack_fffffffffffffe98);
    import_kernel_cmdline(in_stack_000002b4);
    action_for_each_trigger
              ((char *)CONCAT44(_Var2,in_stack_fffffffffffffeb0),
               (_func_void_action_ptr *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    drain_action_queue();
    log_write(6,"<6>init: device init\n");
    property_init();
    if (console[0] != '\0') {
      snprintf(local_128,0x5c,"/dev/%s",console);
      console_name = strdup(local_128);
    }
    local_20 = open(console_name,2);
    if (-1 < local_20) {
      have_console = 1;
    }
    close(local_20);
    if (qemu[0] != '\0') {
      import_kernel_cmdline(in_stack_000002b4);
    }
    action_for_each_trigger
              ((char *)CONCAT44(_Var2,in_stack_fffffffffffffeb0),
               (_func_void_action_ptr *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    drain_action_queue();
    local_18 = start_property_service();
    iVar3 = socketpair(1,1,0,&local_2c);
    if (iVar3 == 0) {
      signal_fd = local_2c;
      local_1c = local_28;
      fcntl(local_2c,2,1);
      fcntl(local_2c,4,0x800);
      fcntl(local_28,2,1);
      fcntl(local_28,4,0x800);
    }
    mkfifo("/dev/initctl",0x180);
    local_14 = open("/dev/initctl",0x800);
    if (((-1 < local_14) && (-1 < local_18)) && (-1 < local_1c)) {
      umask(0x12);
      action_for_each_trigger
                ((char *)CONCAT44(_Var2,in_stack_fffffffffffffeb0),
                 (_func_void_action_ptr *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      action_for_each_trigger
                ((char *)CONCAT44(_Var2,in_stack_fffffffffffffeb0),
                 (_func_void_action_ptr *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      drain_action_queue();
      log_write(3,"<3>init: DONE\n");
      local_148.fd = local_14;
      local_148.events = 1;
      local_140 = local_18;
      local_13c = 1;
      local_138 = local_1c;
      local_134 = 1;
      local_24 = 3;
      local_12c = 0;
      local_12a = 0;
      do {
        do {
          __timeout = -1;
          for (iVar3 = 0; iVar3 < local_24; iVar3 = iVar3 + 1) {
            (&local_148)[iVar3].revents = 0;
          }
          drain_action_queue();
          restart_processes();
          tVar1 = process_needs_restart;
          if (process_needs_restart != 0) {
            tVar4 = gettime();
            __timeout = ((int)tVar1 - (int)tVar4) * 1000;
            if (__timeout < 0) {
              __timeout = 0;
            }
          }
          iVar3 = poll(&local_148,(long)local_24,__timeout);
        } while (iVar3 < 1);
        if (local_132 == 1) {
          read(local_1c,local_128,0x5c);
          do {
            iVar3 = wait_for_one_process(in_stack_ffffffffffffff50);
          } while (iVar3 == 0);
        }
        else {
          if (local_148.revents == 1) {
            handle_init_fd(ufds[0]._4_4_);
          }
          if (local_13a == 1) {
            handle_property_set_fd(in_stack_ffffffffffffff14);
          }
        }
      } while( true );
    }
    log_write(3,"<3>init: init startup failure\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    int init_fd = -1;
    int property_set_fd = -1;
    int signal_recv_fd = -1;
    int fd, fd_count, s[2];
    struct sigaction act;
    char tmp[PROP_NAME_MAX];
    struct pollfd ufds[4];
    pid_t pid;

    //mount("tmpfs", "/tmp", "tmpfs", MS_NODEV|MS_NOSUID, "mode=1777");
    //mount("proc", "/proc", "proc", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);
    //mount("sysfs", "/sys", "sysfs", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);

#if BOOTCHART
    pid = fork();
    if (!pid) { /* child process */
        bootchart_count = bootchart_init();
        if (bootchart_count > 0) {
            NOTICE("bootcharting started (period=%d ms)\n", bootchart_count*BOOTCHART_POLLING_MS);
        } else if (bootchart_count < 0) {
            ERROR("bootcharting init failure\n");
            return 0;
        } else {
            NOTICE("bootcharting ignored\n");
            return 0;
        }

        while (bootchart_count > 0) {
            if (bootchart_step() < 0)
                break;
            --bootchart_count;
            usleep(BOOTCHART_POLLING_MS*1000);
        }
        bootchart_finish();
        return 0;
    }
#endif

    act.sa_handler = sigchld_handler;
    act.sa_flags = SA_NOCLDSTOP;
    act.sa_restorer = NULL;
    sigemptyset(&act.sa_mask);
    sigaction(SIGCHLD, &act, 0);

    /* clear the umask */
    umask(0);

        /* We must have some place other than / to create the
         * device nodes for kmsg and null, otherwise we won't
         * be able to remount / read-only later on.
         * Now that tmpfs is mounted on /dev, we can actually
         * talk to the outside world.
         */
//    open_devnull_stdio();
    log_init();
    
    INFO("reading config file\n");
    parse_config_file(INITRC_FILE_PATH);

    /* pull the kernel commandline and ramdisk properties file in */
    import_kernel_cmdline(0);

    action_for_each_trigger("early-init", action_add_queue_tail);
    drain_action_queue();

    INFO("device init\n");

    property_init();

    if (console[0]) {
        snprintf(tmp, sizeof(tmp), "/dev/%s", console);
        console_name = strdup(tmp);
    }

    fd = open(console_name, O_RDWR);
    if (fd >= 0)
        have_console = 1;
    close(fd);

    if (qemu[0])
        import_kernel_cmdline(1); 
   
        /* execute all the boot actions to get us started */
    action_for_each_trigger("init", action_add_queue_tail);
    drain_action_queue();

        /* read any property files on system or data and
         * fire up the property service.  This must happen
         * after the ro.foo properties are set above so
         * that /data/local.prop cannot interfere with them.
         */
    property_set_fd = start_property_service();

    /* create a signalling mechanism for the sigchld handler */
    if (socketpair(AF_UNIX, SOCK_STREAM, 0, s) == 0) {
        signal_fd = s[0];
        signal_recv_fd = s[1];
        fcntl(s[0], F_SETFD, FD_CLOEXEC);
        fcntl(s[0], F_SETFL, O_NONBLOCK);
        fcntl(s[1], F_SETFD, FD_CLOEXEC);
        fcntl(s[1], F_SETFL, O_NONBLOCK);
    }

    mkfifo("/dev/initctl", 0600);
    init_fd = open("/dev/initctl", O_RDONLY|O_NONBLOCK);
    /* make sure we actually have all the pieces we need */
    if((init_fd < 0) ||
        (property_set_fd < 0) ||
        (signal_recv_fd < 0)) {
        ERROR("init startup failure\n");
        return 1;
    }
    umask(0022);

    /* execute all the boot actions to get us started */
    action_for_each_trigger("early-boot", action_add_queue_tail);
    action_for_each_trigger("boot", action_add_queue_tail);
    drain_action_queue();
    ERROR("DONE\n");

    ufds[0].fd = init_fd;
    ufds[0].events = POLLIN;
    ufds[1].fd = property_set_fd;
    ufds[1].events = POLLIN;
    ufds[2].fd = signal_recv_fd;
    ufds[2].events = POLLIN;
    fd_count = 3;

    ufds[3].events = 0;
    ufds[3].revents = 0;

    for(;;) {
        int nr, i, timeout = -1;

        for (i = 0; i < fd_count; i++)
            ufds[i].revents = 0;

        drain_action_queue();
        restart_processes();

        if (process_needs_restart) {
            timeout = (process_needs_restart - gettime()) * 1000;
            if (timeout < 0)
                timeout = 0;
        }

        nr = poll(ufds, fd_count, timeout);
        if (nr <= 0)
            continue;

        if (ufds[2].revents == POLLIN) {
            /* we got a SIGCHLD - reap and restart as needed */
            read(signal_recv_fd, tmp, sizeof(tmp));
            while (!wait_for_one_process(0))
                ;
            continue;
        }

        if (ufds[0].revents == POLLIN)
            handle_init_fd(init_fd);
        if (ufds[1].revents == POLLIN)
            handle_property_set_fd(property_set_fd);
    }

    return 0;
}